

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O2

void __thiscall
Clasp::ClaspFacade::Statistics::ClingoView::ClingoView(ClingoView *this,ClaspFacade *f)

{
  Summary *this_00;
  Result *obj;
  Summary *this_01;
  StatsMap *pSVar1;
  int iVar2;
  StatsMap *pSVar3;
  StatisticObject SVar4;
  LpStats *pLVar5;
  Accu *x;
  ulong uVar6;
  ulong uVar7;
  StatisticObject local_48;
  AccuPtr *local_40;
  StatsMap *local_38;
  
  ClaspStatistics::ClaspStatistics(&this->super_ClaspStatistics);
  (this->super_ClaspStatistics).super_AbstractStatistics._vptr_AbstractStatistics =
       (_func_int **)&PTR__ClingoView_001e7448;
  pSVar1 = &this->problem_;
  local_38 = &this->solving_;
  this_00 = &this->summary_;
  local_40 = &this->accu_;
  (this->problem_).keys_.ebo_.buf = (pointer)0x0;
  (this->problem_).keys_.ebo_.size = 0;
  (this->problem_).keys_.ebo_.cap = 0;
  (this->solving_).keys_.ebo_.buf = (pointer)0x0;
  (this->solving_).keys_.ebo_.size = 0;
  (this->solving_).keys_.ebo_.cap = 0;
  (this->summary_).super_StatsMap.keys_.ebo_.buf = (pointer)0x0;
  (this->summary_).super_StatsMap.keys_.ebo_.size = 0;
  (this->summary_).super_StatsMap.keys_.ebo_.cap = 0;
  (this->summary_).step.times.stats_ = (Summary *)0x0;
  (this->summary_).step.times.range_.lo = 0;
  (this->summary_).step.times.range_.hi = 0;
  (this->summary_).step.models.stats_ = (Summary *)0x0;
  (this->summary_).step.models.range_.lo = 0;
  (this->summary_).step.models.range_.hi = 0;
  (this->accu_).ptr_ = 0;
  pSVar3 = ClaspStatistics::makeRoot(&this->super_ClaspStatistics);
  this->keys_ = pSVar3;
  SVar4 = StatisticObject::value<unsigned_int,_&Clasp::_getValue>(&(f->step_).step);
  StatsMap::add(&this_00->super_StatsMap,"call",(StatisticObject *)&stack0xffffffffffffffa8);
  if (_ZGVZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getResultEPKS2_EEEEjvE6vtab_s
      == '\0') {
    iVar2 = __cxa_guard_acquire(&
                                _ZGVZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getResultEPKS2_EEEEjvE6vtab_s
                               );
    if (iVar2 != 0) {
      _ZZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getResultEPKS2_EEEEjvE6vtab_s
      ._0_4_ = 1;
      _ZZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getResultEPKS2_EEEEjvE6vtab_s
      ._8_8_ = anon_func::Value_T::value;
      __cxa_guard_release(&
                          _ZGVZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getResultEPKS2_EEEEjvE6vtab_s
                         );
    }
  }
  if (_ZGVZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getResultEPKS2_EEEEjvE2id
      == '\0') {
    iVar2 = __cxa_guard_acquire(&
                                _ZGVZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getResultEPKS2_EEEEjvE2id
                               );
    if (iVar2 != 0) {
      _ZZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getResultEPKS2_EEEEjvE2id
           = StatisticObject::registerType((I *)SVar4.handle_);
      __cxa_guard_release(&
                          _ZGVZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getResultEPKS2_EEEEjvE2id
                         );
    }
  }
  obj = &(f->step_).result;
  StatisticObject::StatisticObject
            ((StatisticObject *)&stack0xffffffffffffffa8,obj,
             _ZZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getResultEPKS2_EEEEjvE2id
            );
  local_48.handle_ = SVar4.handle_;
  StatsMap::add(&this_00->super_StatsMap,"result",&local_48);
  if (_ZGVZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getSignalEPKS2_EEEEjvE6vtab_s
      == '\0') {
    iVar2 = __cxa_guard_acquire(&
                                _ZGVZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getSignalEPKS2_EEEEjvE6vtab_s
                               );
    if (iVar2 != 0) {
      _ZZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getSignalEPKS2_EEEEjvE6vtab_s
      ._0_4_ = 1;
      _ZZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getSignalEPKS2_EEEEjvE6vtab_s
      ._8_8_ = anon_func::Value_T::value;
      __cxa_guard_release(&
                          _ZGVZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getSignalEPKS2_EEEEjvE6vtab_s
                         );
    }
  }
  if (_ZGVZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getSignalEPKS2_EEEEjvE2id
      == '\0') {
    iVar2 = __cxa_guard_acquire(&
                                _ZGVZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getSignalEPKS2_EEEEjvE2id
                               );
    if (iVar2 != 0) {
      _ZZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getSignalEPKS2_EEEEjvE2id
           = StatisticObject::registerType((I *)SVar4.handle_);
      __cxa_guard_release(&
                          _ZGVZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getSignalEPKS2_EEEEjvE2id
                         );
    }
  }
  StatisticObject::StatisticObject
            ((StatisticObject *)&stack0xffffffffffffffa8,obj,
             _ZZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getSignalEPKS2_EEEEjvE2id
            );
  local_48.handle_ = SVar4.handle_;
  StatsMap::add(&this_00->super_StatsMap,"signal",&local_48);
  if (_ZGVZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_113_getExhaustedEPKS2_EEEEjvE6vtab_s
      == '\0') {
    iVar2 = __cxa_guard_acquire(&
                                _ZGVZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_113_getExhaustedEPKS2_EEEEjvE6vtab_s
                               );
    if (iVar2 != 0) {
      _ZZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_113_getExhaustedEPKS2_EEEEjvE6vtab_s
      ._0_4_ = 1;
      _ZZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_113_getExhaustedEPKS2_EEEEjvE6vtab_s
      ._8_8_ = anon_func::Value_T::value;
      __cxa_guard_release(&
                          _ZGVZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_113_getExhaustedEPKS2_EEEEjvE6vtab_s
                         );
    }
  }
  if (_ZGVZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_113_getExhaustedEPKS2_EEEEjvE2id
      == '\0') {
    iVar2 = __cxa_guard_acquire(&
                                _ZGVZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_113_getExhaustedEPKS2_EEEEjvE2id
                               );
    if (iVar2 != 0) {
      _ZZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_113_getExhaustedEPKS2_EEEEjvE2id
           = StatisticObject::registerType((I *)SVar4.handle_);
      __cxa_guard_release(&
                          _ZGVZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_113_getExhaustedEPKS2_EEEEjvE2id
                         );
    }
  }
  StatisticObject::StatisticObject
            ((StatisticObject *)&stack0xffffffffffffffa8,obj,
             _ZZN5Clasp15StatisticObject13registerValueINS_11SolveResultETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_113_getExhaustedEPKS2_EEEEjvE2id
            );
  local_48.handle_ = SVar4.handle_;
  StatsMap::add(&this_00->super_StatsMap,"exhausted",&local_48);
  StatisticObject::array<Clasp::ClaspFacade::SolveData::BoundArray>
            ((BoundArray *)(((f->solve_).ptr_ & 0xfffffffffffffffe) + 0x18));
  StatsMap::add(&this_00->super_StatsMap,"costs",(StatisticObject *)&stack0xffffffffffffffa8);
  SVar4 = StatisticObject::array<Clasp::ClaspFacade::SolveData::BoundArray>
                    ((BoundArray *)(((f->solve_).ptr_ & 0xfffffffffffffffe) + 0x38));
  StatsMap::add(&this_00->super_StatsMap,"lower",(StatisticObject *)&stack0xffffffffffffffa8);
  if (_ZGVZN5Clasp15StatisticObject13registerValueINS_13SharedContextETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_115_getConcurrencyEPKS2_EEEEjvE6vtab_s
      == '\0') {
    iVar2 = __cxa_guard_acquire(&
                                _ZGVZN5Clasp15StatisticObject13registerValueINS_13SharedContextETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_115_getConcurrencyEPKS2_EEEEjvE6vtab_s
                               );
    if (iVar2 != 0) {
      _ZZN5Clasp15StatisticObject13registerValueINS_13SharedContextETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_115_getConcurrencyEPKS2_EEEEjvE6vtab_s
      ._0_4_ = 1;
      _ZZN5Clasp15StatisticObject13registerValueINS_13SharedContextETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_115_getConcurrencyEPKS2_EEEEjvE6vtab_s
      ._8_8_ = anon_func::Value_T::value;
      __cxa_guard_release(&
                          _ZGVZN5Clasp15StatisticObject13registerValueINS_13SharedContextETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_115_getConcurrencyEPKS2_EEEEjvE6vtab_s
                         );
    }
  }
  if (_ZGVZN5Clasp15StatisticObject13registerValueINS_13SharedContextETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_115_getConcurrencyEPKS2_EEEEjvE2id
      == '\0') {
    iVar2 = __cxa_guard_acquire(&
                                _ZGVZN5Clasp15StatisticObject13registerValueINS_13SharedContextETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_115_getConcurrencyEPKS2_EEEEjvE2id
                               );
    if (iVar2 != 0) {
      _ZZN5Clasp15StatisticObject13registerValueINS_13SharedContextETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_115_getConcurrencyEPKS2_EEEEjvE2id
           = StatisticObject::registerType((I *)SVar4.handle_);
      __cxa_guard_release(&
                          _ZGVZN5Clasp15StatisticObject13registerValueINS_13SharedContextETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_115_getConcurrencyEPKS2_EEEEjvE2id
                         );
    }
  }
  StatisticObject::StatisticObject
            ((StatisticObject *)&stack0xffffffffffffffa8,&f->ctx,
             _ZZN5Clasp15StatisticObject13registerValueINS_13SharedContextETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_115_getConcurrencyEPKS2_EEEEjvE2id
            );
  local_48.handle_ = SVar4.handle_;
  StatsMap::add(&this_00->super_StatsMap,"concurrency",&local_48);
  if (_ZGVZN5Clasp15StatisticObject13registerValueINS_13SharedContextETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getWinnerEPKS2_EEEEjvE6vtab_s
      == '\0') {
    iVar2 = __cxa_guard_acquire(&
                                _ZGVZN5Clasp15StatisticObject13registerValueINS_13SharedContextETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getWinnerEPKS2_EEEEjvE6vtab_s
                               );
    if (iVar2 != 0) {
      _ZZN5Clasp15StatisticObject13registerValueINS_13SharedContextETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getWinnerEPKS2_EEEEjvE6vtab_s
      ._0_4_ = 1;
      _ZZN5Clasp15StatisticObject13registerValueINS_13SharedContextETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getWinnerEPKS2_EEEEjvE6vtab_s
      ._8_8_ = anon_func::Value_T::value;
      __cxa_guard_release(&
                          _ZGVZN5Clasp15StatisticObject13registerValueINS_13SharedContextETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getWinnerEPKS2_EEEEjvE6vtab_s
                         );
    }
  }
  if (_ZGVZN5Clasp15StatisticObject13registerValueINS_13SharedContextETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getWinnerEPKS2_EEEEjvE2id
      == '\0') {
    iVar2 = __cxa_guard_acquire(&
                                _ZGVZN5Clasp15StatisticObject13registerValueINS_13SharedContextETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getWinnerEPKS2_EEEEjvE2id
                               );
    if (iVar2 != 0) {
      _ZZN5Clasp15StatisticObject13registerValueINS_13SharedContextETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getWinnerEPKS2_EEEEjvE2id
           = StatisticObject::registerType((I *)SVar4.handle_);
      __cxa_guard_release(&
                          _ZGVZN5Clasp15StatisticObject13registerValueINS_13SharedContextETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getWinnerEPKS2_EEEEjvE2id
                         );
    }
  }
  StatisticObject::StatisticObject
            ((StatisticObject *)&stack0xffffffffffffffa8,&f->ctx,
             _ZZN5Clasp15StatisticObject13registerValueINS_13SharedContextETnPFdPKT_EXadL_ZNS_12_GLOBAL__N_110_getWinnerEPKS2_EEEEjvE2id
            );
  local_48.handle_ = SVar4.handle_;
  StatsMap::add(&this_00->super_StatsMap,"winner",&local_48);
  this_01 = &f->step_;
  (this->summary_).step.times.stats_ = this_01;
  (this->summary_).step.times.range_.lo = 0;
  (this->summary_).step.times.range_.hi = 5;
  (this->summary_).step.models.stats_ = this_01;
  (this->summary_).step.models.range_.lo = 5;
  (this->summary_).step.models.range_.hi = 7;
  StepStats::addTo(&(this->summary_).step,&this_00->super_StatsMap);
  pLVar5 = Summary::lpStats(this_01);
  if (pLVar5 != (LpStats *)0x0) {
    pLVar5 = Summary::lpStats(this_01);
    StatisticObject::map<Clasp::Asp::LpStats>(pLVar5);
    StatsMap::add(pSVar1,"lp",(StatisticObject *)&stack0xffffffffffffffa8);
    if (1 < (f->accu_).ptr_) {
      pLVar5 = Summary::lpStep(this_01);
      StatisticObject::map<Clasp::Asp::LpStats>(pLVar5);
      StatsMap::add(pSVar1,"lpStep",(StatisticObject *)&stack0xffffffffffffffa8);
    }
  }
  StatisticObject::map<Clasp::ProblemStats>(&(f->ctx).stats_);
  StatsMap::add(pSVar1,"generator",(StatisticObject *)&stack0xffffffffffffffa8);
  pSVar3 = this->keys_;
  StatisticObject::map<Clasp::StatsMap>(pSVar1);
  StatsMap::add(pSVar3,"problem",(StatisticObject *)&stack0xffffffffffffffa8);
  pSVar1 = this->keys_;
  StatisticObject::map<Clasp::StatsMap>(local_38);
  StatsMap::add(pSVar1,"solving",(StatisticObject *)&stack0xffffffffffffffa8);
  pSVar1 = this->keys_;
  StatisticObject::map<Clasp::StatsMap>(&this_00->super_StatsMap);
  StatsMap::add(pSVar1,"summary",(StatisticObject *)&stack0xffffffffffffffa8);
  if (1 < (f->accu_).ptr_) {
    x = (Accu *)operator_new(0x40);
    (x->solving_).keys_.ebo_.buf = (pointer)0x0;
    (x->solving_).keys_.ebo_.size = 0;
    (x->solving_).keys_.ebo_.cap = 0;
    (x->step).models.stats_ = (Summary *)0x0;
    (x->step).models.range_.lo = 0;
    (x->step).models.range_.hi = 0;
    (x->step).times.stats_ = (Summary *)0x0;
    (x->step).times.range_.lo = 0;
    (x->step).times.range_.hi = 0;
    (x->super_StatsMap).keys_.ebo_.buf = (pointer)0x0;
    (x->super_StatsMap).keys_.ebo_.size = 0;
    (x->super_StatsMap).keys_.ebo_.cap = 0;
    SingleOwnerPtr<Clasp::ClaspFacade::Statistics::ClingoView::Accu,_Clasp::DeleteObject>::reset
              (local_40,x);
    uVar6 = local_40->ptr_ & 0xfffffffffffffffe;
    uVar7 = (f->accu_).ptr_ & 0xfffffffffffffffe;
    *(ulong *)(uVar6 + 0x10) = uVar7;
    *(undefined8 *)(uVar6 + 0x18) = 0x500000000;
    *(ulong *)(uVar6 + 0x20) = uVar7;
    *(undefined8 *)(uVar6 + 0x28) = 0x700000005;
  }
  return;
}

Assistant:

ClaspFacade::Statistics::ClingoView::ClingoView(const ClaspFacade& f) {
	keys_ = makeRoot();
	summary_.add("call"       , StatisticObject::value(&f.step_.step));
	summary_.add("result"     , StatisticObject::value<SolveResult, _getResult>(&f.step_.result));
	summary_.add("signal"     , StatisticObject::value<SolveResult, _getSignal>(&f.step_.result));
	summary_.add("exhausted"  , StatisticObject::value<SolveResult, _getExhausted>(&f.step_.result));
	summary_.add("costs"      , StatisticObject::array(&f.solve_->costs));
	summary_.add("lower"      , StatisticObject::array(&f.solve_->lower));
	summary_.add("concurrency", StatisticObject::value<SharedContext, _getConcurrency>(&f.ctx));
	summary_.add("winner"     , StatisticObject::value<SharedContext, _getWinner>(&f.ctx));
	summary_.step.bind(f.step_);
	summary_.step.addTo(summary_);
	if (f.step_.lpStats()) {
		problem_.add("lp", StatisticObject::map(f.step_.lpStats()));
		if (f.incremental()) { problem_.add("lpStep", StatisticObject::map(f.step_.lpStep())); }
	}
	problem_.add("generator", StatisticObject::map(&f.ctx.stats()));
	keys_->add("problem", problem_.toStats());
	keys_->add("solving", solving_.toStats());
	keys_->add("summary", summary_.toStats());

	if (f.incremental()) {
		accu_ = new Accu();
		accu_->step.bind(*f.accu_.get());
	}
}